

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::ForwardEuler(ForwardEuler *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  
  FixedStepIntegrator::FixedStepIntegrator(&this->super_FixedStepIntegrator);
  (this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__ForwardEuler_0019a720;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_computationBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_stateJacBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_controlJacBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_identity);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_zeroNxNxBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_zeroNuNuBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_zeroNxNuBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_stateHessianBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_controlHessianBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_mixedHessianBuffer);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_lambda);
  this->m_hasStateJacobianSparsity = false;
  this->m_hasControlJacobianSparsity = false;
  p_Var1 = &(this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->m_controlJacobianSparsity).
           super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::string::_M_replace((ulong)peVar2,0,(char *)(peVar2->name)._M_string_length,0x185021)
  ;
  peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2->isExplicit = true;
  peVar2->numberOfStages = 1;
  return;
}

Assistant:

ForwardEuler::ForwardEuler()
            {
                m_infoData->name = "ForwardEuler";
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 1;
            }